

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlRegexpPtr xmlRegexpCompile(xmlChar *regexp)

{
  xmlRegParserCtxtPtr ctxt;
  xmlChar *pxVar1;
  xmlRegStatePtr pxVar2;
  xmlRegexpPtr pxVar3;
  
  ctxt = (xmlRegParserCtxtPtr)(*xmlMalloc)(0x78);
  if (ctxt == (xmlRegParserCtxtPtr)0x0) {
    return (xmlRegexpPtr)0x0;
  }
  ctxt->counters = (xmlRegCounter *)0x0;
  ctxt->determinist = 0;
  ctxt->negs = 0;
  ctxt->states = (xmlRegStatePtr *)0x0;
  ctxt->maxCounters = 0;
  ctxt->nbCounters = 0;
  ctxt->atoms = (xmlRegAtomPtr *)0x0;
  ctxt->maxStates = 0;
  ctxt->nbStates = 0;
  ctxt->atom = (xmlRegAtomPtr)0x0;
  ctxt->maxAtoms = 0;
  ctxt->nbAtoms = 0;
  ctxt->end = (xmlRegStatePtr)0x0;
  ctxt->state = (xmlRegStatePtr)0x0;
  ctxt->error = 0;
  ctxt->neg = 0;
  ctxt->start = (xmlRegStatePtr)0x0;
  ctxt->string = (xmlChar *)0x0;
  ctxt->cur = (xmlChar *)0x0;
  ctxt->flags = 0;
  ctxt->depth = 0;
  if (regexp == (xmlChar *)0x0) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = xmlStrdup(regexp);
    ctxt->string = pxVar1;
  }
  ctxt->cur = pxVar1;
  ctxt->error = 0;
  ctxt->neg = 0;
  ctxt->determinist = -1;
  ctxt->negs = 0;
  ctxt->end = (xmlRegStatePtr)0x0;
  pxVar2 = (xmlRegStatePtr)(*xmlMalloc)(0x38);
  if (pxVar2 == (xmlRegStatePtr)0x0) {
    xmlRegexpErrMemory(ctxt,"allocating state");
  }
  else {
    pxVar2->maxTransTo = 0;
    pxVar2->nbTransTo = 0;
    pxVar2->transTo = (int *)0x0;
    *(undefined8 *)&pxVar2->nbTrans = 0;
    pxVar2->trans = (xmlRegTrans *)0x0;
    pxVar2->markd = XML_REGEXP_MARK_NORMAL;
    pxVar2->reached = XML_REGEXP_MARK_NORMAL;
    pxVar2->no = 0;
    pxVar2->maxTrans = 0;
    pxVar2->type = XML_REGEXP_TRANS_STATE;
    pxVar2->mark = XML_REGEXP_MARK_NORMAL;
  }
  ctxt->state = pxVar2;
  ctxt->start = pxVar2;
  xmlRegStatePush(ctxt,pxVar2);
  xmlFAParseRegExp(ctxt,1);
  if (*ctxt->cur != '\0') {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"xmlFAParseRegExp: extra characters");
  }
  if (ctxt->error == 0) {
    pxVar2 = ctxt->state;
    ctxt->end = pxVar2;
    ctxt->start->type = XML_REGEXP_START_STATE;
    pxVar2->type = XML_REGEXP_FINAL_STATE;
    xmlFAEliminateEpsilonTransitions(ctxt);
    if (ctxt->error == 0) {
      pxVar3 = xmlRegEpxFromParse(ctxt);
      goto LAB_001a1204;
    }
  }
  pxVar3 = (xmlRegexpPtr)0x0;
LAB_001a1204:
  xmlRegFreeParserCtxt(ctxt);
  return pxVar3;
}

Assistant:

xmlRegexpPtr
xmlRegexpCompile(const xmlChar *regexp) {
    xmlRegexpPtr ret;
    xmlRegParserCtxtPtr ctxt;

    ctxt = xmlRegNewParserCtxt(regexp);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->end = NULL;
    ctxt->start = ctxt->state = xmlRegNewState(ctxt);
    xmlRegStatePush(ctxt, ctxt->start);

    /* parse the expression building an automata */
    xmlFAParseRegExp(ctxt, 1);
    if (CUR != 0) {
	ERROR("xmlFAParseRegExp: extra characters");
    }
    if (ctxt->error != 0) {
	xmlRegFreeParserCtxt(ctxt);
	return(NULL);
    }
    ctxt->end = ctxt->state;
    ctxt->start->type = XML_REGEXP_START_STATE;
    ctxt->end->type = XML_REGEXP_FINAL_STATE;

    /* remove the Epsilon except for counted transitions */
    xmlFAEliminateEpsilonTransitions(ctxt);


    if (ctxt->error != 0) {
	xmlRegFreeParserCtxt(ctxt);
	return(NULL);
    }
    ret = xmlRegEpxFromParse(ctxt);
    xmlRegFreeParserCtxt(ctxt);
    return(ret);
}